

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O2

void __thiscall
GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash
          (GeneralHash<0,_unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint uVar1;
  ostream *poVar2;
  allocator_type local_11;
  
  this->hashvalue = 0;
  this->wordsize = mywordsize;
  this->n = myn;
  this->irreduciblepoly = 0;
  uVar1 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar1);
  this->lastbit = 1 << ((byte)this->wordsize & 0x1f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->precomputedshift,0,&local_11);
  if (this->wordsize == 0x13) {
    uVar1 = 0x80027;
  }
  else {
    if (this->wordsize != 9) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"unsupported wordsize ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->wordsize);
      poVar2 = std::operator<<(poVar2," bits, try 19 or 9");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    uVar1 = 0x22d;
  }
  this->irreduciblepoly = uVar1;
  return;
}

Assistant:

GeneralHash(int myn, int mywordsize = 19)
      : hashvalue(0), wordsize(mywordsize), n(myn), irreduciblepoly(0),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        lastbit(static_cast<hashvaluetype>(1) << wordsize),
        precomputedshift(precomputationtype == FULLPRECOMP ? (1 << n) : 0) {
    if (wordsize == 19) {
      irreduciblepoly = 1 + (1 << 1) + (1 << 2) + (1 << 5) + (1 << 19);
    } else if (wordsize == 9) {
      irreduciblepoly = 1 + (1 << 2) + (1 << 3) + (1 << 5) + (1 << 9);
    } else {
      cerr << "unsupported wordsize " << wordsize << " bits, try 19 or 9"
           << endl;
    }
    // in case the precomp is activated at the template level
    if (precomputationtype == FULLPRECOMP) {
      for (hashvaluetype x = 0; x < precomputedshift.size(); ++x) {
        hashvaluetype leftover = x << (wordsize - n);
        fastleftshift(leftover, n);
        precomputedshift[x] = leftover;
      }
    }
  }